

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
          (InternalMetadata *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)(this->ptr_ & 0xfffffffffffffffc);
  puVar1 = puVar2;
  if ((this->ptr_ & 1U) != 0) {
    puVar1 = (undefined8 *)*puVar2;
  }
  if (puVar1 != (undefined8 *)0x0) {
    return;
  }
  if (puVar2 != (undefined8 *)0x0) {
    std::__cxx11::string::~string((string *)(puVar2 + 1));
  }
  operator_delete(puVar2,0x28);
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }